

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O0

double orient3dfast(double *pa,double *pb,double *pc,double *pd)

{
  double cdz;
  double bdz;
  double adz;
  double cdy;
  double bdy;
  double ady;
  double cdx;
  double bdx;
  double adx;
  double *pd_local;
  double *pc_local;
  double *pb_local;
  double *pa_local;
  
  return (*pc - *pd) * ((pa[1] - pd[1]) * (pb[2] - pd[2]) + -((pa[2] - pd[2]) * (pb[1] - pd[1]))) +
         (*pa - *pd) * ((pb[1] - pd[1]) * (pc[2] - pd[2]) + -((pb[2] - pd[2]) * (pc[1] - pd[1]))) +
         (*pb - *pd) * ((pc[1] - pd[1]) * (pa[2] - pd[2]) + -((pc[2] - pd[2]) * (pa[1] - pd[1])));
}

Assistant:

REAL orient3dfast(REAL *pa, REAL *pb, REAL *pc, REAL *pd)
{
  REAL adx, bdx, cdx;
  REAL ady, bdy, cdy;
  REAL adz, bdz, cdz;

  adx = pa[0] - pd[0];
  bdx = pb[0] - pd[0];
  cdx = pc[0] - pd[0];
  ady = pa[1] - pd[1];
  bdy = pb[1] - pd[1];
  cdy = pc[1] - pd[1];
  adz = pa[2] - pd[2];
  bdz = pb[2] - pd[2];
  cdz = pc[2] - pd[2];

  return adx * (bdy * cdz - bdz * cdy)
       + bdx * (cdy * adz - cdz * ady)
       + cdx * (ady * bdz - adz * bdy);
}